

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.h
# Opt level: O2

Colori get_color(Colorf col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 local_28;
  undefined4 uStack_24;
  
  fVar1 = floorf(col.b * 255.0);
  uStack_24 = col.g;
  fVar2 = floorf(uStack_24 * 255.0);
  local_28 = col.r;
  fVar3 = floorf(local_28 * 255.0);
  return (int)fVar3 | (int)fVar2 << 8 | (int)fVar1 << 0x10 | 0xff000000;
}

Assistant:

Colori get_color(Colorf col)
{
#if GAMMA_CORRECTION
    // Gamma correction
    float gamma = 1 / 2.2f;
    col.r = std::pow(clampf(col.r), gamma);
    col.g = std::pow(clampf(col.g), gamma);
    col.b = std::pow(clampf(col.b), gamma);
#endif
    // Convert a valid Colorf to Colori
    return (255 << 24) | ((int)std::floor(col.b * 255) << 16) | ((int)std::floor(col.g * 255) << 8) | (int)std::floor(col.r * 255);
}